

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O0

bool spvtools::opt::descsroautil::IsDescriptorStruct(IRContext *context,Instruction *var)

{
  bool bVar1;
  Op OVar2;
  uint32_t id;
  DefUseManager *this;
  Operand *this_00;
  Instruction *local_28;
  Instruction *var_type_inst;
  Instruction *var_local;
  IRContext *context_local;
  
  local_28 = anon_unknown_0::GetVariableType(context,var);
  if (local_28 == (Instruction *)0x0) {
    context_local._7_1_ = false;
  }
  else {
    while (OVar2 = Instruction::opcode(local_28), OVar2 == OpTypeArray) {
      this = IRContext::get_def_use_mgr(context);
      this_00 = Instruction::GetInOperand(local_28,0);
      id = Operand::AsId(this_00);
      local_28 = analysis::DefUseManager::GetDef(this,id);
    }
    OVar2 = Instruction::opcode(local_28);
    if (OVar2 == OpTypeStruct) {
      bVar1 = IsTypeOfStructuredBuffer(context,local_28);
      if (bVar1) {
        context_local._7_1_ = false;
      }
      else {
        context_local._7_1_ = anon_unknown_0::HasDescriptorDecorations(context,var);
      }
    }
    else {
      context_local._7_1_ = false;
    }
  }
  return context_local._7_1_;
}

Assistant:

bool IsDescriptorStruct(IRContext* context, Instruction* var) {
  Instruction* var_type_inst = GetVariableType(context, var);
  if (var_type_inst == nullptr) return false;

  while (var_type_inst->opcode() == spv::Op::OpTypeArray) {
    var_type_inst = context->get_def_use_mgr()->GetDef(
        var_type_inst->GetInOperand(0).AsId());
  }

  if (var_type_inst->opcode() != spv::Op::OpTypeStruct) return false;

  // All structures with descriptor assignments must be replaced by variables,
  // one for each of their members - with the exceptions of buffers.
  if (IsTypeOfStructuredBuffer(context, var_type_inst)) {
    return false;
  }

  return HasDescriptorDecorations(context, var);
}